

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::GrowIndex(ImFont *this,int new_size)

{
  int iVar1;
  undefined4 in_EAX;
  undefined4 uStack_18;
  float local_14;
  
  iVar1 = (this->IndexAdvanceX).Size;
  if (iVar1 == (this->IndexLookup).Size) {
    if (iVar1 < new_size) {
      _uStack_18 = CONCAT44(0xbf800000,in_EAX);
      ImVector<float>::resize(&this->IndexAdvanceX,new_size,&local_14);
      uStack_18 = CONCAT22(0xffff,(undefined2)uStack_18);
      ImVector<unsigned_short>::resize
                (&this->IndexLookup,new_size,(unsigned_short *)((long)&uStack_18 + 2));
    }
    return;
  }
  __assert_fail("IndexAdvanceX.Size == IndexLookup.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                ,0xb44,"void ImFont::GrowIndex(int)");
}

Assistant:

void ImFont::GrowIndex(int new_size)
{
    IM_ASSERT(IndexAdvanceX.Size == IndexLookup.Size);
    if (new_size <= IndexLookup.Size)
        return;
    IndexAdvanceX.resize(new_size, -1.0f);
    IndexLookup.resize(new_size, (ImWchar)-1);
}